

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL3_glfw::GLTextureBuffer::resize
          (GLTextureBuffer *this,uint newX,uint newY)

{
  TextureFormat *x;
  int iVar1;
  uint uVar2;
  uint uVar3;
  PFNGLTEXIMAGE2DPROC p_Var4;
  GLenum GVar5;
  GLenum GVar6;
  GLenum GVar7;
  runtime_error *this_00;
  socklen_t in_ECX;
  sockaddr *__addr;
  
  TextureBuffer::resize(&this->super_TextureBuffer,newX,newY);
  bind(this,newX,__addr,in_ECX);
  p_Var4 = glad_glTexImage2D;
  iVar1 = (this->super_TextureBuffer).dim;
  if (iVar1 == 2) {
    x = &(this->super_TextureBuffer).format;
    GVar5 = internalFormat(x);
    uVar2 = (this->super_TextureBuffer).sizeX;
    uVar3 = (this->super_TextureBuffer).sizeY;
    GVar6 = formatF(x);
    GVar7 = backend_openGL3_glfw::type(x);
    (*p_Var4)(0xde1,0,GVar5,uVar2,uVar3,0,GVar6,GVar7,(void *)0x0);
  }
  else if (iVar1 == 1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"OpenGL error: called 2D resize on 1D texture");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  checkGLError(true);
  return;
}

Assistant:

void GLTextureBuffer::resize(unsigned int newX, unsigned int newY) {

  TextureBuffer::resize(newX, newY);

  bind();
  if (dim == 1) {
    throw std::runtime_error("OpenGL error: called 2D resize on 1D texture");
  }
  if (dim == 2) {
    glTexImage2D(GL_TEXTURE_2D, 0, internalFormat(format), sizeX, sizeY, 0, formatF(format), type(format), nullptr);
  }
  checkGLError();
}